

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::
Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
Matcher(Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *this,string *s)

{
  pointer pcVar1;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).vtable_ = (VTable *)0x0;
  (this->
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017a8e8;
  pcVar1 = (s->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>((string *)&local_80,pcVar1,pcVar1 + s->_M_string_length)
  ;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_80,local_80 + local_78);
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017ab70;
  local_60.vtable_ =
       (VTable *)
       internal::MatcherBase<std::__cxx11::string_const&>::
       GetVTable<testing::internal::MatcherBase<std::__cxx11::string_const&>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>()
       ::kVTable_abi_cxx11_;
  local_60.buffer_.ptr = operator_new(0x28);
  ((local_60.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
  *(undefined8 **)(local_60.buffer_.i + 8) = (undefined8 *)(local_60.buffer_.i + 0x18);
  if (local_48 == &local_38) {
    *(undefined8 *)(local_60.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
    *(undefined8 *)(local_60.buffer_.i + 0x20) = uStack_30;
  }
  else {
    *(undefined1 **)(local_60.buffer_.i + 8) = local_48;
    *(ulong *)(local_60.buffer_.i + 0x18) = CONCAT71(uStack_37,local_38);
  }
  *(undefined8 *)(local_60.buffer_.i + 0x10) = local_40;
  local_40 = 0;
  local_38 = 0;
  local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0017a8e8;
  local_48 = &local_38;
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::operator=(&this->
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ,&local_60);
  internal::
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~MatcherBase(&local_60);
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return;
}

Assistant:

Matcher<const std::string&>::Matcher(const std::string& s) { *this = Eq(s); }